

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

bool __thiscall VmaBlockMetadata_TLSF::Validate(VmaBlockMetadata_TLSF *this)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  undefined4 extraout_var;
  VkDeviceSize VVar4;
  Block **ppBVar5;
  VkAllocationCallbacks *this_00;
  undefined4 extraout_var_00;
  VmaBlockMetadata *in_RDI;
  Block *freeBlock_1;
  bool found;
  Block *freeBlock;
  uint32_t listIndex;
  Block *prev;
  ValidationContext validateCtx;
  VkDeviceSize nextOffset;
  Block *block;
  uint32_t list;
  size_t freeCount;
  size_t allocCount;
  VkDeviceSize calculatedFreeSize;
  VkDeviceSize calculatedSize;
  ValidationContext *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  VmaBlockMetadata_TLSF *this_01;
  Block *local_80;
  Block *local_70;
  Block *local_60;
  VkDeviceSize local_48;
  Block *local_40;
  uint local_34;
  VkDeviceSize local_30;
  _func_int **local_28;
  long local_20;
  VkDeviceSize local_18;
  bool local_1;
  
  iVar2 = (*in_RDI->_vptr_VmaBlockMetadata[6])();
  VVar4 = VmaBlockMetadata::GetSize(in_RDI);
  if (VVar4 < CONCAT44(extraout_var,iVar2)) {
    local_1 = false;
  }
  else {
    local_18 = *(VkDeviceSize *)(in_RDI[9].m_Size + 8);
    local_20 = *(long *)(in_RDI[9].m_Size + 8);
    local_28 = (_func_int **)0x0;
    local_30 = 0;
    for (local_34 = 0; local_34 < (uint)in_RDI[7].m_BufferImageGranularity; local_34 = local_34 + 1)
    {
      local_40 = *(Block **)(*(long *)&in_RDI[7].m_IsVirtual + (ulong)local_34 * 8);
      if (local_40 != (Block *)0x0) {
        bVar1 = Block::IsFree(local_40);
        if (!bVar1) {
          return false;
        }
        ppBVar5 = Block::PrevFree(local_40);
        if (*ppBVar5 != (Block *)0x0) {
          return false;
        }
        while (ppBVar5 = Block::NextFree(local_40), *ppBVar5 != (Block *)0x0) {
          ppBVar5 = Block::NextFree(local_40);
          bVar1 = Block::IsFree(*ppBVar5);
          if (!bVar1) {
            return false;
          }
          ppBVar5 = Block::NextFree(local_40);
          ppBVar5 = Block::PrevFree(*ppBVar5);
          if (*ppBVar5 != local_40) {
            return false;
          }
          ppBVar5 = Block::NextFree(local_40);
          local_40 = *ppBVar5;
        }
      }
    }
    local_48 = *(VkDeviceSize *)in_RDI[9].m_Size;
    this_01 = (VmaBlockMetadata_TLSF *)&in_RDI[9].m_pAllocationCallbacks;
    this_00 = VmaBlockMetadata::GetAllocationCallbacks(in_RDI);
    VmaBlockMetadata::IsVirtual(in_RDI);
    VmaBlockBufferImageGranularity::StartValidation
              ((VmaBlockBufferImageGranularity *)this_01,
               (VkAllocationCallbacks *)
               CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
               SUB81((ulong)in_stack_ffffffffffffff50 >> 0x38,0));
    if (*(long *)(in_RDI[9].m_Size + 0x18) == 0) {
      if ((*(long *)(in_RDI[9].m_Size + 0x10) == 0) ||
         (*(VkDeviceSize *)(*(long *)(in_RDI[9].m_Size + 0x10) + 0x18) == in_RDI[9].m_Size)) {
        for (local_60 = *(Block **)(in_RDI[9].m_Size + 0x10); local_60 != (Block *)0x0;
            local_60 = local_60->prevPhysical) {
          if (local_60->offset + local_60->size != local_48) {
            return false;
          }
          local_48 = local_60->offset;
          local_18 = local_60->size + local_18;
          uVar3 = GetListIndex(this_01,CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58)
                              );
          bVar1 = Block::IsFree(local_60);
          if (bVar1) {
            local_30 = local_30 + 1;
            local_70 = *(Block **)(*(long *)&in_RDI[7].m_IsVirtual + (ulong)uVar3 * 8);
            if (local_70 == (Block *)0x0) {
              return false;
            }
            bVar1 = false;
            do {
              if (local_70 == local_60) {
                bVar1 = true;
              }
              ppBVar5 = Block::NextFree(local_70);
              local_70 = *ppBVar5;
              in_stack_ffffffffffffff5f = !bVar1 && local_70 != (Block *)0x0;
            } while ((bool)in_stack_ffffffffffffff5f);
            if (!bVar1) {
              return false;
            }
            local_20 = local_60->size + local_20;
          }
          else {
            local_28 = (_func_int **)((long)local_28 + 1);
            local_80 = *(Block **)(*(long *)&in_RDI[7].m_IsVirtual + (ulong)uVar3 * 8);
            while (local_80 != (Block *)0x0) {
              if (local_80 == local_60) {
                return false;
              }
              ppBVar5 = Block::NextFree(local_80);
              local_80 = *ppBVar5;
            }
            bVar1 = VmaBlockMetadata::IsVirtual(in_RDI);
            if ((!bVar1) &&
               (bVar1 = VmaBlockBufferImageGranularity::Validate
                                  ((VmaBlockBufferImageGranularity *)this_00,
                                   (ValidationContext *)this_01,
                                   CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                                   (VkDeviceSize)in_stack_ffffffffffffff50), !bVar1)) {
              return false;
            }
          }
          if ((local_60->prevPhysical != (Block *)0x0) &&
             (local_60->prevPhysical->nextPhysical != local_60)) {
            return false;
          }
        }
        bVar1 = VmaBlockMetadata::IsVirtual(in_RDI);
        if ((bVar1) ||
           (bVar1 = VmaBlockBufferImageGranularity::FinishValidation
                              ((VmaBlockBufferImageGranularity *)
                               CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                               in_stack_ffffffffffffff50), bVar1)) {
          if (local_48 == 0) {
            VVar4 = VmaBlockMetadata::GetSize(in_RDI);
            if (local_18 == VVar4) {
              iVar2 = (*in_RDI->_vptr_VmaBlockMetadata[6])();
              if (local_20 == CONCAT44(extraout_var_00,iVar2)) {
                if (local_28 == in_RDI[1]._vptr_VmaBlockMetadata) {
                  if (local_30 == in_RDI[1].m_Size) {
                    local_1 = true;
                  }
                  else {
                    local_1 = false;
                  }
                }
                else {
                  local_1 = false;
                }
              }
              else {
                local_1 = false;
              }
            }
            else {
              local_1 = false;
            }
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool VmaBlockMetadata_TLSF::Validate() const
{
    VMA_VALIDATE(GetSumFreeSize() <= GetSize());

    VkDeviceSize calculatedSize = m_NullBlock->size;
    VkDeviceSize calculatedFreeSize = m_NullBlock->size;
    size_t allocCount = 0;
    size_t freeCount = 0;

    // Check integrity of free lists
    for (uint32_t list = 0; list < m_ListsCount; ++list)
    {
        Block* block = m_FreeList[list];
        if (block != VMA_NULL)
        {
            VMA_VALIDATE(block->IsFree());
            VMA_VALIDATE(block->PrevFree() == VMA_NULL);
            while (block->NextFree())
            {
                VMA_VALIDATE(block->NextFree()->IsFree());
                VMA_VALIDATE(block->NextFree()->PrevFree() == block);
                block = block->NextFree();
            }
        }
    }

    VkDeviceSize nextOffset = m_NullBlock->offset;
    auto validateCtx = m_GranularityHandler.StartValidation(GetAllocationCallbacks(), IsVirtual());

    VMA_VALIDATE(m_NullBlock->nextPhysical == VMA_NULL);
    if (m_NullBlock->prevPhysical)
    {
        VMA_VALIDATE(m_NullBlock->prevPhysical->nextPhysical == m_NullBlock);
    }
    // Check all blocks
    for (Block* prev = m_NullBlock->prevPhysical; prev != VMA_NULL; prev = prev->prevPhysical)
    {
        VMA_VALIDATE(prev->offset + prev->size == nextOffset);
        nextOffset = prev->offset;
        calculatedSize += prev->size;

        uint32_t listIndex = GetListIndex(prev->size);
        if (prev->IsFree())
        {
            ++freeCount;
            // Check if free block belongs to free list
            Block* freeBlock = m_FreeList[listIndex];
            VMA_VALIDATE(freeBlock != VMA_NULL);

            bool found = false;
            do
            {
                if (freeBlock == prev)
                    found = true;

                freeBlock = freeBlock->NextFree();
            } while (!found && freeBlock != VMA_NULL);

            VMA_VALIDATE(found);
            calculatedFreeSize += prev->size;
        }
        else
        {
            ++allocCount;
            // Check if taken block is not on a free list
            Block* freeBlock = m_FreeList[listIndex];
            while (freeBlock)
            {
                VMA_VALIDATE(freeBlock != prev);
                freeBlock = freeBlock->NextFree();
            }

            if (!IsVirtual())
            {
                VMA_VALIDATE(m_GranularityHandler.Validate(validateCtx, prev->offset, prev->size));
            }
        }

        if (prev->prevPhysical)
        {
            VMA_VALIDATE(prev->prevPhysical->nextPhysical == prev);
        }
    }

    if (!IsVirtual())
    {
        VMA_VALIDATE(m_GranularityHandler.FinishValidation(validateCtx));
    }

    VMA_VALIDATE(nextOffset == 0);
    VMA_VALIDATE(calculatedSize == GetSize());
    VMA_VALIDATE(calculatedFreeSize == GetSumFreeSize());
    VMA_VALIDATE(allocCount == m_AllocCount);
    VMA_VALIDATE(freeCount == m_BlocksFreeCount);

    return true;
}